

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.cpp
# Opt level: O2

int finishpcall(lua_State *L,int status)

{
  int iVar1;
  
  iVar1 = lua_checkstack(L,1);
  if (iVar1 != 0) {
    lua_pushboolean(L,status);
    lua_replace(L,1);
    iVar1 = lua_gettop(L);
    return iVar1;
  }
  lua_settop(L,0);
  lua_pushboolean(L,0);
  lua_pushstring(L,"stack overflow");
  return 2;
}

Assistant:

static int finishpcall (lua_State *L, int status) {
  if (!lua_checkstack(L, 1)) {  /* no space for extra boolean? */
    lua_settop(L, 0);  /* create space for return values */
    lua_pushboolean(L, 0);
    lua_pushstring(L, "stack overflow");
    return 2;  /* return false, msg */
  }
  lua_pushboolean(L, status);  /* first result (status) */
  lua_replace(L, 1);  /* put first result in first slot */
  return lua_gettop(L);
}